

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O3

int __thiscall agg::bezier_arc::init(bezier_arc *this,EVP_PKEY_CTX *ctx)

{
  uint extraout_EAX;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  double in_XMM0_Qa;
  double start_angle;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double dVar5;
  double sweep_angle;
  double dVar6;
  
  start_angle = fmod(in_XMM4_Qa,6.283185307179586);
  dVar4 = 6.283185307179586;
  if (in_XMM5_Qa <= 6.283185307179586) {
    dVar4 = in_XMM5_Qa;
  }
  dVar5 = -6.283185307179586;
  if (-6.283185307179586 <= dVar4) {
    dVar5 = dVar4;
  }
  if ((1e-10 <= ABS(in_XMM5_Qa) || 6.283185307179586 <= in_XMM5_Qa) || dVar4 <= -6.283185307179586)
  {
    *(undefined4 *)(this + 4) = 2;
    *(undefined4 *)(this + 0xd8) = 4;
    uVar2 = 2;
    dVar4 = 0.0;
    do {
      sweep_angle = -1.5707963267948966;
      if (0.0 <= dVar5) {
        sweep_angle = 1.5707963267948966;
        dVar6 = dVar4 + 1.5707963267948966;
        bVar3 = dVar6 < dVar5 + -0.01;
      }
      else {
        dVar6 = dVar4 + -1.5707963267948966;
        bVar3 = dVar5 + 0.01 < dVar6;
      }
      if (!bVar3) {
        sweep_angle = dVar5 - dVar4;
      }
      arc_to_bezier(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,start_angle,sweep_angle,
                    (double *)(this + uVar2 * 8 + -8));
      uVar1 = *(int *)(this + 4) + 6;
      uVar2 = (ulong)uVar1;
      *(uint *)(this + 4) = uVar1;
    } while ((bVar3) && (start_angle = start_angle + sweep_angle, dVar4 = dVar6, uVar1 < 0x1a));
  }
  else {
    *(undefined4 *)(this + 4) = 4;
    *(undefined4 *)(this + 0xd8) = 2;
    dVar4 = cos(start_angle);
    *(double *)(this + 8) = dVar4 * in_XMM2_Qa + in_XMM0_Qa;
    dVar4 = sin(start_angle);
    *(double *)(this + 0x10) = dVar4 * in_XMM3_Qa + in_XMM1_Qa;
    dVar4 = cos(dVar5 + start_angle);
    *(double *)(this + 0x18) = dVar4 * in_XMM2_Qa + in_XMM0_Qa;
    dVar4 = sin(dVar5 + start_angle);
    *(double *)(this + 0x20) = dVar4 * in_XMM3_Qa + in_XMM1_Qa;
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

void bezier_arc::init(double x,  double y, 
                          double rx, double ry, 
                          double start_angle, 
                          double sweep_angle)
    {
        start_angle = fmod(start_angle, 2.0 * pi);
        if(sweep_angle >=  2.0 * pi) sweep_angle =  2.0 * pi;
        if(sweep_angle <= -2.0 * pi) sweep_angle = -2.0 * pi;

        if(fabs(sweep_angle) < 1e-10)
        {
            m_num_vertices = 4;
            m_cmd = path_cmd_line_to;
            m_vertices[0] = x + rx * cos(start_angle);
            m_vertices[1] = y + ry * sin(start_angle);
            m_vertices[2] = x + rx * cos(start_angle + sweep_angle);
            m_vertices[3] = y + ry * sin(start_angle + sweep_angle);
            return;
        }

        double total_sweep = 0.0;
        double local_sweep = 0.0;
        double prev_sweep;
        m_num_vertices = 2;
        m_cmd = path_cmd_curve4;
        bool done = false;
        do
        {
            if(sweep_angle < 0.0)
            {
                prev_sweep  = total_sweep;
                local_sweep = -pi * 0.5;
                total_sweep -= pi * 0.5;
                if(total_sweep <= sweep_angle + bezier_arc_angle_epsilon)
                {
                    local_sweep = sweep_angle - prev_sweep;
                    done = true;
                }
            }
            else
            {
                prev_sweep  = total_sweep;
                local_sweep =  pi * 0.5;
                total_sweep += pi * 0.5;
                if(total_sweep >= sweep_angle - bezier_arc_angle_epsilon)
                {
                    local_sweep = sweep_angle - prev_sweep;
                    done = true;
                }
            }

            arc_to_bezier(x, y, rx, ry, 
                          start_angle, 
                          local_sweep, 
                          m_vertices + m_num_vertices - 2);

            m_num_vertices += 6;
            start_angle += local_sweep;
        }
        while(!done && m_num_vertices < 26);
    }